

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_single_path.cpp
# Opt level: O0

void __thiscall agg::trans_single_path::finalize_path(trans_single_path *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  vertex_dist *pvVar4;
  vertex_dist *pvVar5;
  double d_1;
  vertex_dist *v;
  double d;
  double dist;
  uint i;
  trans_single_path *this_local;
  
  if ((this->m_status == making_path) &&
     (uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this),
     1 < uVar3)) {
    vertex_sequence<agg::vertex_dist,_6U>::close(&this->m_src_vertices,0);
    uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
    if (2 < uVar3) {
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3 - 2);
      dVar1 = pvVar4->dist;
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3 - 3);
      if (dVar1 * 10.0 < pvVar4->dist) {
        uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3 - 3);
        dVar1 = pvVar4->dist;
        uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3 - 2);
        dVar2 = pvVar4->dist;
        uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3 - 1);
        uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        pvVar5 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3 - 2);
        pvVar5->x = pvVar4->x;
        pvVar5->y = pvVar4->y;
        pvVar5->dist = pvVar4->dist;
        pod_bvector<agg::vertex_dist,_6U>::remove_last((pod_bvector<agg::vertex_dist,_6U> *)this);
        uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3 - 2);
        pvVar4->dist = dVar1 + dVar2;
      }
    }
    d = 0.0;
    for (dist._4_4_ = 0;
        uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this),
        dist._4_4_ < uVar3; dist._4_4_ = dist._4_4_ + 1) {
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,dist._4_4_);
      dVar1 = pvVar4->dist;
      pvVar4->dist = d;
      d = dVar1 + d;
    }
    uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
    this->m_kindex = (double)(uVar3 - 1) / d;
    this->m_status = ready;
  }
  return;
}

Assistant:

void trans_single_path::finalize_path()
    {
        if(m_status == making_path && m_src_vertices.size() > 1)
        {
            unsigned i;
            double dist;
            double d;

            m_src_vertices.close(false);
            if(m_src_vertices.size() > 2)
            {
                if(m_src_vertices[m_src_vertices.size() - 2].dist * 10.0 < 
                   m_src_vertices[m_src_vertices.size() - 3].dist)
                {
                    d = m_src_vertices[m_src_vertices.size() - 3].dist + 
                        m_src_vertices[m_src_vertices.size() - 2].dist;

                    m_src_vertices[m_src_vertices.size() - 2] = 
                        m_src_vertices[m_src_vertices.size() - 1];

                    m_src_vertices.remove_last();
                    m_src_vertices[m_src_vertices.size() - 2].dist = d;
                }
            }

            dist = 0.0;
            for(i = 0; i < m_src_vertices.size(); i++)
            {
                vertex_dist& v = m_src_vertices[i];
                double d = v.dist;
                v.dist = dist;
                dist += d;
            }
            m_kindex = (m_src_vertices.size() - 1) / dist;
            m_status = ready;
        }
    }